

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O3

int nettlp_run_cb(nettlp **nt,int nnts,nettlp_cb *cb,void *arg)

{
  _func_int_nettlp_ptr_tlp_mr_hdr_ptr_void_ptr_size_t_void_ptr *p_Var1;
  nettlp *pnVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  _func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *p_Var8;
  void *pvVar9;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  pollfd x [16];
  char buf [4096];
  pollfd local_10b8 [16];
  undefined1 local_1038 [6];
  tlp_cpl_hdr local_1032;
  undefined1 auStack_1022 [4082];
  
  if (nnts < 0x11) {
    if (0 < nnts) {
      uVar7 = 0;
      do {
        local_10b8[uVar7].fd = nt[uVar7]->sockfd;
        local_10b8[uVar7].events = 1;
        uVar7 = uVar7 + 1;
      } while ((uint)nnts != uVar7);
    }
    uVar4 = 0;
    if (stop_flag == '\0') {
      do {
        uVar4 = poll(local_10b8,(long)nnts,500);
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 0) {
          return uVar4;
        }
        if (uVar4 != 0 && 0 < nnts) {
          uVar13 = 0;
          do {
            if ((local_10b8[uVar13].revents & 1) == 0) goto LAB_0010314c;
            uVar7 = read(nt[uVar13]->sockfd,local_1038,0x1000);
            uVar4 = (uint)uVar7;
            if ((int)uVar4 < 0) break;
            bVar3 = local_1032.tlp.fmt_type & 0x5f;
            if (bVar3 < 0x40) {
              if ((local_1032.tlp.fmt_type & 0x5f) == 0) {
                p_Var8 = (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)cb->mrd;
              }
              else {
                if (bVar3 != 10) goto LAB_0010312d;
                p_Var8 = cb->cpl;
              }
              if (p_Var8 == (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)0x0) goto LAB_0010312d;
LAB_0010313b:
              (*p_Var8)(nt[uVar13],&local_1032,arg);
            }
            else if (bVar3 == 0x40) {
              p_Var1 = cb->mwr;
              if (p_Var1 == (_func_int_nettlp_ptr_tlp_mr_hdr_ptr_void_ptr_size_t_void_ptr *)0x0)
              goto LAB_0010312d;
              pnVar2 = nt[uVar13];
              pvVar9 = tlp_mwr_data((tlp_mr_hdr *)&local_1032);
              iVar5 = tlp_mr_data_length((tlp_mr_hdr *)&local_1032);
              (*p_Var1)(pnVar2,(tlp_mr_hdr *)&local_1032,pvVar9,(long)iVar5,arg);
            }
            else if ((bVar3 == 0x4a) &&
                    (cb->cpld !=
                     (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr_size_t_void_ptr *)0x0)) {
              uVar10 = local_1032.lowaddr & 3;
              uVar4 = (ushort)(local_1032.tlp.falen << 8 | local_1032.tlp.falen >> 8) & 0x3ff;
              uVar11 = (local_1032.stcnt & 0xff0f) << 8 | local_1032.stcnt >> 8;
              uVar12 = uVar4 * 4 - uVar10;
              if (uVar10 + uVar11 + 3 >> 2 == uVar4) {
                uVar12 = (uint)uVar11;
              }
              (*cb->cpld)(nt[uVar13],&local_1032,
                          auStack_1022 +
                          (ulong)uVar10 + (ulong)((local_1032.tlp.fmt_type & 0x20) >> 5) * 4,
                          (long)(int)uVar12,arg);
            }
            else {
LAB_0010312d:
              p_Var8 = (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)cb->other;
              if (p_Var8 != (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)0x0) goto LAB_0010313b;
            }
LAB_0010314c:
            uVar4 = (uint)uVar7;
            uVar13 = uVar13 + 1;
          } while ((uint)nnts != uVar13);
        }
      } while (stop_flag != '\x01');
    }
  }
  else {
    piVar6 = __errno_location();
    *piVar6 = -0x16;
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

int nettlp_run_cb(struct nettlp **nt, int nnts,
		  struct nettlp_cb *cb, void *arg)
{
	int ret = 0, n;
	ssize_t received;
	struct pollfd x[NETTLP_CB_MAX_NTS];
	char buf[4096];
	struct nettlp_hdr *nh;
	struct tlp_hdr *th;
	struct tlp_mr_hdr *mh;
	struct tlp_cpl_hdr *ch;

	if (nnts > NETTLP_CB_MAX_NTS) {
		errno = -EINVAL;
		return -1;
	}

	for (n = 0; n < nnts; n++) {
		x[n].fd = nt[n]->sockfd;
		x[n].events = POLLIN;
	}

	while (1) {

		if (stop_flag)
			break;

		ret = poll(x, nnts, LIBTLP_CPL_TIMEOUT);
		if (ret < 0)
			break;

		if (ret == 0)
			continue;	/* timeout */

		for (n = 0; n < nnts; n++) {

			if (!(x[n].revents & POLLIN))
				continue;

			ret = read(nt[n]->sockfd, buf, sizeof(buf));
			if (ret < 0)
				break;

			nh = (struct nettlp_hdr *)buf;
			th = (struct tlp_hdr *)(nh + 1);
			mh = (struct tlp_mr_hdr *)th;
			ch = (struct tlp_cpl_hdr *)th;

			if (tlp_is_mrd(th->fmt_type) && cb->mrd) {
				cb->mrd(nt[n], mh, arg);
			} else if (tlp_is_mwr(th->fmt_type) && cb->mwr) {

				cb->mwr(nt[n], mh, tlp_mwr_data(mh),
					tlp_mr_data_length(mh), arg);

			} else if (tlp_is_cpl(th->fmt_type) &&
				   tlp_is_wo_data(th->fmt_type) && cb->cpl) {

				cb->cpl(nt[n], ch, arg);

			} else if (tlp_is_cpl(th->fmt_type) &&
				   tlp_is_w_data(th->fmt_type) && cb->cpld) {

				cb->cpld(nt[n], ch, tlp_cpld_data(ch),
					 tlp_cpld_data_length(ch), arg);
			} else if (cb->other) {
				cb->other(nt[n], th, arg);
			}
		}
	}

	return ret;
}